

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O1

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info)

{
  pointer *ppcVar1;
  ulong *puVar2;
  uint uVar3;
  iterator iVar4;
  pointer piVar5;
  pointer pvVar6;
  int *piVar7;
  int *piVar8;
  pointer pmVar9;
  change_set cVar10;
  change_set cVar11;
  iterator iVar12;
  iterator iVar13;
  int iVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  int *piVar18;
  uint uVar19;
  uint *puVar20;
  uint *puVar21;
  vector<int,_std::allocator<int>_> to_be_added;
  change_set cur_move_1;
  change_set cur_move;
  int local_a0;
  int local_9c;
  uint *local_98;
  iterator iStack_90;
  int *local_88;
  AdjList *local_80;
  uint *local_78;
  iterator iStack_70;
  int *local_68;
  change_set local_58;
  change_set local_50;
  vector<int,_std::allocator<int>_> *local_48;
  int *local_40;
  ulong local_38;
  
  local_50.node = *node;
  local_50.block =
       (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[local_50.node];
  iVar4._M_current =
       (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_80 = G;
  local_48 = block_weights;
  if (iVar4._M_current ==
      (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
              ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar4,&local_50);
  }
  else {
    cVar11.block = local_50.block;
    cVar11.node = local_50.node;
    *iVar4._M_current = cVar11;
    ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[*node] = *to_block;
  piVar5 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar15 = piVar5 + *to_block;
  *piVar15 = *piVar15 + 1;
  piVar15 = piVar5 + 2;
  *piVar15 = *piVar15 + -1;
  uVar16 = (ulong)*node;
  uVar17 = uVar16 + 0x3f;
  if (-1 < (long)uVar16) {
    uVar17 = uVar16;
  }
  puVar2 = (moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar17 >> 6) +
           (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)*node & 0x3f);
  local_68 = (int *)0x0;
  local_78 = (uint *)0x0;
  iStack_70._M_current = (int *)0x0;
  local_88 = (int *)0x0;
  local_98 = (uint *)0x0;
  iStack_90._M_current = (int *)0x0;
  pvVar6 = (local_80->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar15 = pvVar6[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = pvVar6[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar20 = local_78;
  iVar12._M_current = iStack_70._M_current;
  if (piVar15 != piVar7) {
    local_38 = 0x800000000000003f;
    local_40 = other_block;
    do {
      local_a0 = *piVar15;
      if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_a0] < 0) {
        iVar14 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_a0];
        if (iVar14 == *other_block) {
          local_58.block =
               (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_a0];
          iVar4._M_current =
               (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_58.node = local_a0;
          if (iVar4._M_current ==
              (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
                      ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar4,
                       &local_58);
          }
          else {
            cVar10.block = local_58.block;
            cVar10.node = local_a0;
            *iVar4._M_current = cVar10;
            ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[local_a0] = 2;
          piVar5 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar18 = piVar5 + *other_block;
          *piVar18 = *piVar18 + -1;
          piVar18 = piVar5 + 2;
          *piVar18 = *piVar18 + 1;
          uVar16 = (ulong)local_a0;
          uVar17 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar17 = uVar16;
          }
          if (((moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar17 >> 6) +
                (ulong)((uVar16 & local_38) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar16 & 0x3f) & 1) == 0) {
            if (iStack_70._M_current == local_68) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_a0);
            }
            else {
              *iStack_70._M_current = local_a0;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
          pvVar6 = (local_80->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar8 = pvVar6[local_a0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar18 = pvVar6[local_a0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; other_block = local_40, piVar18 != piVar8
              ; piVar18 = piVar18 + 1) {
            local_9c = *piVar18;
            if (((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_9c] < 0) &&
               (iVar14 = (*(((queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_priority_queue_interface)._vptr_priority_queue_interface[0xd])(),
               (char)iVar14 != '\0')) {
              if (iStack_90._M_current == local_88) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_9c);
              }
              else {
                *iStack_90._M_current = local_9c;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
          }
        }
        else if (iVar14 == 2) {
          if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_a0);
          }
          else {
            *iStack_90._M_current = local_a0;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
      }
      piVar15 = piVar15 + 1;
      puVar20 = local_78;
      iVar12._M_current = iStack_70._M_current;
    } while (piVar15 != piVar7);
  }
  for (; iVar13._M_current = iStack_90._M_current, puVar21 = local_98,
      puVar20 != (uint *)iVar12._M_current; puVar20 = puVar20 + 1) {
    uVar3 = *puVar20;
    pvVar6 = (local_80->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar15 = pvVar6[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar7 = pvVar6[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar15 == piVar7) {
      uVar17 = 1;
      uVar19 = 1;
    }
    else {
      uVar17 = 1;
      uVar19 = 1;
      do {
        if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[*piVar15] < 0) {
          iVar14 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[*piVar15];
          if (iVar14 == 1) {
            uVar17 = (ulong)((int)uVar17 - 1);
          }
          else if (iVar14 == 0) {
            uVar19 = uVar19 - 1;
          }
        }
        piVar15 = piVar15 + 1;
      } while (piVar15 != piVar7);
    }
    pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*(pmVar9->super_priority_queue_interface)._vptr_priority_queue_interface[4])
              (pmVar9,(ulong)uVar3,uVar17);
    pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*pmVar9[1].super_priority_queue_interface._vptr_priority_queue_interface[4])
              (pmVar9 + 1,(ulong)uVar3,(ulong)uVar19);
  }
  for (; puVar21 != (uint *)iVar13._M_current; puVar21 = puVar21 + 1) {
    uVar3 = *puVar21;
    pvVar6 = (local_80->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar15 = pvVar6[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar7 = pvVar6[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar15 == piVar7) {
      uVar17 = 1;
      uVar19 = 1;
    }
    else {
      uVar17 = 1;
      uVar19 = 1;
      do {
        if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[*piVar15] < 0) {
          iVar14 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[*piVar15];
          if (iVar14 == 1) {
            uVar17 = (ulong)((int)uVar17 - 1);
          }
          else if (iVar14 == 0) {
            uVar19 = uVar19 - 1;
          }
        }
        piVar15 = piVar15 + 1;
      } while (piVar15 != piVar7);
    }
    pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*(pmVar9->super_priority_queue_interface)._vptr_priority_queue_interface[10])
              (pmVar9,(ulong)uVar3,uVar17);
    pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*pmVar9[1].super_priority_queue_interface._vptr_priority_queue_interface[10])
              (pmVar9 + 1,(ulong)uVar3,(ulong)uVar19);
  }
  if (local_98 != (uint *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_78 != (uint *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node])
        {
                if (x[neighbor] < 0) {
                        if (partition_index[neighbor] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if (queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}